

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedNumberFormat::RuleBasedNumberFormat
          (RuleBasedNumberFormat *this,URBNFRuleSetTag tag,Locale *alocale,UErrorCode *status)

{
  UBool UVar1;
  UResourceBundle *resourceBundle;
  char *valid;
  char *actual;
  UResourceBundle *resB;
  UChar *pUVar2;
  undefined4 srcLength;
  int32_t len;
  UParseError perror;
  UnicodeString desc;
  int32_t local_e4;
  UResourceBundle *local_e0;
  ConstChar16Ptr local_d8;
  long local_d0;
  UChar *local_c8;
  UnicodeString local_b8;
  UnicodeString local_70;
  
  NumberFormat::NumberFormat(&this->super_NumberFormat);
  (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedNumberFormat_003e5080;
  this->defaultRuleSet = (NFRuleSet *)0x0;
  this->fRuleSets = (NFRuleSet **)0x0;
  this->ruleSetDescriptions = (UnicodeString *)0x0;
  this->numRuleSets = 0;
  Locale::Locale(&this->locale,alocale);
  this->defaultInfinityRule = (NFRule *)0x0;
  this->defaultNaNRule = (NFRule *)0x0;
  this->collator = (RuleBasedCollator *)0x0;
  this->decimalFormatSymbols = (DecimalFormatSymbols *)0x0;
  this->fRoundingMode = kRoundUnnecessary;
  this->lenient = '\0';
  this->lenientParseRules = (UnicodeString *)0x0;
  this->localizations = (LocalizationInfo *)0x0;
  (this->originalDescription).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f5be0;
  (this->originalDescription).fUnion.fStackFields.fLengthAndFlags = 2;
  this->capitalizationInfoSet = '\0';
  this->capitalizationForUIListMenu = '\0';
  this->capitalizationForStandAlone = '\0';
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (tag < URBNF_COUNT) {
      local_d0 = (long)*(int *)(&DAT_003272e8 + (ulong)tag * 4);
      resourceBundle = ures_open_63("icudt63l-rbnf",(this->locale).fullName,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        valid = ures_getLocaleByType_63(resourceBundle,ULOC_VALID_LOCALE,status);
        actual = ures_getLocaleByType_63(resourceBundle,ULOC_ACTUAL_LOCALE,status);
        Format::setLocaleIDs((Format *)this,valid,actual);
        local_e0 = ures_getByKeyWithFallback_63
                             (resourceBundle,"RBNFRules",(UResourceBundle *)0x0,status);
        if (U_ZERO_ERROR < *status) {
          ures_close_63(resourceBundle);
        }
        resB = ures_getByKeyWithFallback_63
                         (local_e0,&DAT_003272e8 + local_d0,(UResourceBundle *)0x0,status);
        if (U_ZERO_ERROR < *status) {
          ures_close_63(local_e0);
          ures_close_63(resourceBundle);
          return;
        }
        local_70.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_003f5be0;
        local_70.fUnion.fStackFields.fLengthAndFlags = 2;
        while (UVar1 = ures_hasNext_63(resB), UVar1 != '\0') {
          local_b8.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)&PTR__UnicodeString_003f5be0;
          local_b8.fUnion.fStackFields.fLengthAndFlags = 2;
          local_e4 = 0;
          pUVar2 = ures_getNextString_63(resB,&local_e4,(char **)0x0,status);
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            local_d8.p_ = pUVar2;
            UnicodeString::setTo(&local_b8,'\x01',&local_d8,local_e4);
            local_c8 = local_d8.p_;
          }
          else {
            UnicodeString::setToBogus(&local_b8);
          }
          srcLength = local_b8.fUnion.fFields.fLength;
          if (-1 < local_b8.fUnion.fStackFields.fLengthAndFlags) {
            srcLength = (int)local_b8.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          UnicodeString::doAppend(&local_70,&local_b8,0,srcLength);
          UnicodeString::~UnicodeString(&local_b8);
        }
        init(this,(EVP_PKEY_CTX *)&local_70);
        ures_close_63(resB);
        ures_close_63(local_e0);
        UnicodeString::~UnicodeString(&local_70);
      }
      ures_close_63(resourceBundle);
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

RuleBasedNumberFormat::RuleBasedNumberFormat(URBNFRuleSetTag tag, const Locale& alocale, UErrorCode& status)
  : fRuleSets(NULL)
  , ruleSetDescriptions(NULL)
  , numRuleSets(0)
  , defaultRuleSet(NULL)
  , locale(alocale)
  , collator(NULL)
  , decimalFormatSymbols(NULL)
  , defaultInfinityRule(NULL)
  , defaultNaNRule(NULL)
  , fRoundingMode(DecimalFormat::ERoundingMode::kRoundUnnecessary)
  , lenient(FALSE)
  , lenientParseRules(NULL)
  , localizations(NULL)
  , capitalizationInfoSet(FALSE)
  , capitalizationForUIListMenu(FALSE)
  , capitalizationForStandAlone(FALSE)
  , capitalizationBrkIter(NULL)
{
    if (U_FAILURE(status)) {
        return;
    }

    const char* rules_tag = "RBNFRules";
    const char* fmt_tag = "";
    switch (tag) {
    case URBNF_SPELLOUT: fmt_tag = "SpelloutRules"; break;
    case URBNF_ORDINAL: fmt_tag = "OrdinalRules"; break;
    case URBNF_DURATION: fmt_tag = "DurationRules"; break;
    case URBNF_NUMBERING_SYSTEM: fmt_tag = "NumberingSystemRules"; break;
    default: status = U_ILLEGAL_ARGUMENT_ERROR; return;
    }

    // TODO: read localization info from resource
    LocalizationInfo* locinfo = NULL;

    UResourceBundle* nfrb = ures_open(U_ICUDATA_RBNF, locale.getName(), &status);
    if (U_SUCCESS(status)) {
        setLocaleIDs(ures_getLocaleByType(nfrb, ULOC_VALID_LOCALE, &status),
                     ures_getLocaleByType(nfrb, ULOC_ACTUAL_LOCALE, &status));

        UResourceBundle* rbnfRules = ures_getByKeyWithFallback(nfrb, rules_tag, NULL, &status);
        if (U_FAILURE(status)) {
            ures_close(nfrb);
        }
        UResourceBundle* ruleSets = ures_getByKeyWithFallback(rbnfRules, fmt_tag, NULL, &status);
        if (U_FAILURE(status)) {
            ures_close(rbnfRules);
            ures_close(nfrb);
            return;
        }

        UnicodeString desc;
        while (ures_hasNext(ruleSets)) {
           desc.append(ures_getNextUnicodeString(ruleSets,NULL,&status));
        }
        UParseError perror;

        init(desc, locinfo, perror, status);

        ures_close(ruleSets);
        ures_close(rbnfRules);
    }
    ures_close(nfrb);
}